

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalysis.cpp
# Opt level: O0

void __thiscall
luna::SemanticAnalysisVisitor::Visit(SemanticAnalysisVisitor *this,VarList *var_list,void *data)

{
  bool bVar1;
  pointer pSVar2;
  size_type sVar3;
  size_type *in_RDX;
  long in_RSI;
  __normal_iterator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_*,_std::vector<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>_>
  *in_RDI;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *var;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>
  *__range1;
  ExpVarData exp_var_data;
  vector<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>
  *in_stack_ffffffffffffffa8;
  __normal_iterator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_*,_std::vector<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>_>
  local_38;
  long local_30;
  ExpVarData local_24;
  size_type *local_18;
  long local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  ExpVarData::ExpVarData(&local_24,SemanticOp_Write);
  local_30 = local_10 + 8;
  local_38._M_current =
       (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
       std::
       vector<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>
       ::begin(in_stack_ffffffffffffffa8);
  std::
  vector<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>
  ::end(in_stack_ffffffffffffffa8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_*,_std::vector<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>_>
                               *)in_stack_ffffffffffffffa8);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_*,_std::vector<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>_>
    ::operator*(&local_38);
    pSVar2 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator->
                       ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                        0x192736);
    (*pSVar2->_vptr_SyntaxTree[2])(pSVar2,in_RDI,&local_24);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_*,_std::vector<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>_>
    ::operator++(&local_38);
  }
  sVar3 = std::
          vector<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>
          ::size((vector<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>
                  *)(local_10 + 8));
  *local_18 = sVar3;
  return;
}

Assistant:

void SemanticAnalysisVisitor::Visit(VarList *var_list, void *data)
    {
        ExpVarData exp_var_data{ SemanticOp_Write };
        for (auto &var : var_list->var_list_)
            var->Accept(this, &exp_var_data);
        static_cast<VarListData *>(data)->var_count_ = var_list->var_list_.size();
    }